

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_b64encode.c
# Opt level: O2

int archive_filter_b64encode_options(archive_write_filter *f,char *key,char *value)

{
  uint *puVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  char *fmt;
  archive *a;
  
  puVar1 = (uint *)f->data;
  iVar2 = strcmp(key,"mode");
  if (iVar2 == 0) {
    if (value == (char *)0x0) {
      a = f->archive;
      fmt = "mode option requires octal digits";
      goto LAB_00259219;
    }
    sVar3 = strlen(value);
    uVar4 = 0;
    for (sVar5 = 0; (sVar3 != sVar5 && ((value[sVar5] & 0xf8U) == 0x30)); sVar5 = sVar5 + 1) {
      uVar4 = (uint)(byte)(value[sVar5] - 0x30) + uVar4 * 8;
    }
    *puVar1 = uVar4 & 0x1ff;
  }
  else {
    iVar2 = strcmp(key,"name");
    if (iVar2 != 0) {
      return -0x14;
    }
    if (value == (char *)0x0) {
      a = f->archive;
      fmt = "name option requires a string";
LAB_00259219:
      archive_set_error(a,-1,fmt);
      return -0x19;
    }
    puVar1[4] = 0;
    puVar1[5] = 0;
    sVar3 = strlen(value);
    archive_strncat((archive_string *)(puVar1 + 2),value,sVar3);
  }
  return 0;
}

Assistant:

static int
archive_filter_b64encode_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct private_b64encode *state = (struct private_b64encode *)f->data;

	if (strcmp(key, "mode") == 0) {
		if (value == NULL) {
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "mode option requires octal digits");
			return (ARCHIVE_FAILED);
		}
		state->mode = (int)atol8(value, strlen(value)) & 0777;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "name") == 0) {
		if (value == NULL) {
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "name option requires a string");
			return (ARCHIVE_FAILED);
		}
		archive_strcpy(&state->name, value);
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}